

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O0

void crnlib::dxt_fast::find_representative_colors
               (uint n,color_quad_u8 *pBlock,color_quad_u8 *lo,color_quad_u8 *hi)

{
  byte bVar1;
  uchar uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  uchar uVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  byte *pbVar17;
  uchar *puVar18;
  color_quad<unsigned_char,_int> *this;
  uint local_130;
  uint local_12c;
  uint i_7;
  uint energy [2];
  uint i_6;
  uint i_5;
  uint j;
  uint8 uStack_110;
  uint8 uStack_10f;
  uint8 new_color8 [2] [3];
  uint match_index;
  int dot;
  color_quad_u8 *c;
  uint i_4;
  int mid_dot;
  int hi_dot;
  int lo_dot;
  int vec_b;
  int vec_g;
  int vec_r;
  uint weight [2];
  uint64 new_color [2] [3];
  uint iter_index;
  uint cMaxIters;
  uint i_3;
  color_quad_u8 hi_color;
  int dist_1;
  int b_1;
  int g_1;
  int r_1;
  uint i_2;
  uint opp_index;
  int opp_dist;
  color_quad_u8 lo_color;
  int dist;
  int b;
  int g;
  int r;
  uint i_1;
  uint furthest_index;
  int furthest_dist;
  uint ave [3];
  uint i;
  uint64 ave64 [3];
  color_quad_u8 *hi_local;
  color_quad_u8 *lo_local;
  color_quad_u8 *pBlock_local;
  uint n_local;
  
  stack0xffffffffffffffb8 = 0;
  ave64[0] = 0;
  ave64[1] = 0;
  for (ave[1] = 0; ave[1] < n; ave[1] = ave[1] + 1) {
    register0x00000000 = (ulong)pBlock[ave[1]].field_0.field_0.r + stack0xffffffffffffffb8;
    ave64[0] = pBlock[ave[1]].field_0.field_0.g + ave64[0];
    ave64[1] = pBlock[ave[1]].field_0.field_0.b + ave64[1];
  }
  furthest_index = (uint)((stack0xffffffffffffffb8 + (ulong)(n >> 1)) / (ulong)n);
  furthest_dist = (int)((ave64[0] + (n >> 1)) / (ulong)n);
  ave[0] = (uint)((ave64[1] + (n >> 1)) / (ulong)n);
  i_1 = 0xffffffff;
  r = 0;
  for (g = 0; (uint)g < n; g = g + 1) {
    iVar13 = pBlock[(uint)g].field_0.field_0.r - furthest_index;
    iVar14 = (uint)pBlock[(uint)g].field_0.field_0.g - furthest_dist;
    lo_color.field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
         (pBlock[(uint)g].field_0.field_0.b - ave[0]);
    opp_dist = iVar13 * iVar13 + iVar14 * iVar14 + (int)lo_color.field_0 * (int)lo_color.field_0;
    if ((int)i_1 < opp_dist) {
      r = g;
      i_1 = opp_dist;
    }
  }
  color_quad<unsigned_char,_int>::color_quad
            ((color_quad<unsigned_char,_int> *)&opp_index,pBlock + (uint)r);
  i_2 = 0xffffffff;
  r_1 = 0;
  for (g_1 = 0; (uint)g_1 < n; g_1 = g_1 + 1) {
    iVar13 = (uint)pBlock[(uint)g_1].field_0.field_0.r - (uint)(byte)opp_index;
    iVar14 = (uint)pBlock[(uint)g_1].field_0.field_0.g - (uint)opp_index._1_1_;
    hi_color.field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
         ((uint)pBlock[(uint)g_1].field_0.field_0.b - (uint)opp_index._2_1_);
    i_3 = iVar13 * iVar13 + iVar14 * iVar14 + (int)hi_color.field_0 * (int)hi_color.field_0;
    if ((int)i_2 < (int)i_3) {
      r_1 = g_1;
      i_2 = i_3;
    }
  }
  color_quad<unsigned_char,_int>::color_quad
            ((color_quad<unsigned_char,_int> *)&cMaxIters,pBlock + (uint)r_1);
  for (iter_index = 0; iter_index < 3; iter_index = iter_index + 1) {
    pbVar17 = color_quad<unsigned_char,_int>::operator[]
                        ((color_quad<unsigned_char,_int> *)&opp_index,iter_index);
    bVar1 = *pbVar17;
    uVar8 = (&furthest_index)[iter_index];
    puVar18 = color_quad<unsigned_char,_int>::operator[]
                        ((color_quad<unsigned_char,_int> *)&opp_index,iter_index);
    *puVar18 = (uchar)(bVar1 + uVar8 >> 1);
    pbVar17 = color_quad<unsigned_char,_int>::operator[]
                        ((color_quad<unsigned_char,_int> *)&cMaxIters,iter_index);
    bVar1 = *pbVar17;
    uVar8 = (&furthest_index)[iter_index];
    puVar18 = color_quad<unsigned_char,_int>::operator[]
                        ((color_quad<unsigned_char,_int> *)&cMaxIters,iter_index);
    *puVar18 = (uchar)(bVar1 + uVar8 >> 1);
  }
  for (new_color[1][2]._4_4_ = 0; new_color[1][2]._4_4_ < 4;
      new_color[1][2]._4_4_ = new_color[1][2]._4_4_ + 1) {
    puVar18 = color_quad<unsigned_char,_int>::operator[]
                        ((color_quad<unsigned_char,_int> *)&opp_index,0);
    uVar2 = *puVar18;
    puVar18 = color_quad<unsigned_char,_int>::operator[]
                        ((color_quad<unsigned_char,_int> *)&cMaxIters,0);
    if (uVar2 == *puVar18) {
      puVar18 = color_quad<unsigned_char,_int>::operator[]
                          ((color_quad<unsigned_char,_int> *)&opp_index,1);
      uVar2 = *puVar18;
      puVar18 = color_quad<unsigned_char,_int>::operator[]
                          ((color_quad<unsigned_char,_int> *)&cMaxIters,1);
      if (uVar2 == *puVar18) {
        puVar18 = color_quad<unsigned_char,_int>::operator[]
                            ((color_quad<unsigned_char,_int> *)&opp_index,2);
        uVar2 = *puVar18;
        puVar18 = color_quad<unsigned_char,_int>::operator[]
                            ((color_quad<unsigned_char,_int> *)&cMaxIters,2);
        if (uVar2 == *puVar18) break;
      }
    }
    utils::zero_object<unsigned_long_long[2][3]>((unsigned_long_long (*) [2] [3])weight);
    utils::zero_object<unsigned_int[2]>((uint (*) [2])&vec_g);
    pbVar17 = color_quad<unsigned_char,_int>::operator[]
                        ((color_quad<unsigned_char,_int> *)&cMaxIters,0);
    bVar1 = *pbVar17;
    pbVar17 = color_quad<unsigned_char,_int>::operator[]
                        ((color_quad<unsigned_char,_int> *)&opp_index,0);
    iVar13 = (uint)bVar1 - (uint)*pbVar17;
    pbVar17 = color_quad<unsigned_char,_int>::operator[]
                        ((color_quad<unsigned_char,_int> *)&cMaxIters,1);
    bVar1 = *pbVar17;
    pbVar17 = color_quad<unsigned_char,_int>::operator[]
                        ((color_quad<unsigned_char,_int> *)&opp_index,1);
    iVar14 = (uint)bVar1 - (uint)*pbVar17;
    pbVar17 = color_quad<unsigned_char,_int>::operator[]
                        ((color_quad<unsigned_char,_int> *)&cMaxIters,2);
    bVar1 = *pbVar17;
    pbVar17 = color_quad<unsigned_char,_int>::operator[]
                        ((color_quad<unsigned_char,_int> *)&opp_index,2);
    iVar15 = (uint)bVar1 - (uint)*pbVar17;
    pbVar17 = color_quad<unsigned_char,_int>::operator[]
                        ((color_quad<unsigned_char,_int> *)&opp_index,0);
    bVar1 = *pbVar17;
    pbVar17 = color_quad<unsigned_char,_int>::operator[]
                        ((color_quad<unsigned_char,_int> *)&opp_index,1);
    bVar3 = *pbVar17;
    pbVar17 = color_quad<unsigned_char,_int>::operator[]
                        ((color_quad<unsigned_char,_int> *)&opp_index,2);
    bVar4 = *pbVar17;
    pbVar17 = color_quad<unsigned_char,_int>::operator[]
                        ((color_quad<unsigned_char,_int> *)&cMaxIters,0);
    bVar5 = *pbVar17;
    pbVar17 = color_quad<unsigned_char,_int>::operator[]
                        ((color_quad<unsigned_char,_int> *)&cMaxIters,1);
    bVar6 = *pbVar17;
    pbVar17 = color_quad<unsigned_char,_int>::operator[]
                        ((color_quad<unsigned_char,_int> *)&cMaxIters,2);
    bVar7 = *pbVar17;
    for (c._4_4_ = 0; c._4_4_ < n; c._4_4_ = c._4_4_ + 1) {
      this = pBlock + c._4_4_;
      bVar10 = color_quad<unsigned_char,_int>::operator[](this,0);
      bVar11 = color_quad<unsigned_char,_int>::operator[](this,1);
      bVar12 = color_quad<unsigned_char,_int>::operator[](this,2);
      new_color8._2_4_ =
           (uint)bVar10 * iVar13 * 2 + (uint)bVar11 * iVar14 * 2 + (uint)bVar12 * iVar15 * 2;
      uVar16 = (uint)((int)(iVar13 * (uint)bVar1 + iVar14 * (uint)bVar3 + iVar15 * (uint)bVar4 +
                           iVar13 * (uint)bVar5 + iVar14 * (uint)bVar6 + iVar15 * (uint)bVar7) <
                     (int)new_color8._2_4_);
      uStack_110 = (char)uVar16;
      uStack_10f = (char)(uVar16 >> 8);
      new_color8[0][0] = (char)(uVar16 >> 0x10);
      new_color8[0][1] = (char)(uVar16 >> 0x18);
      new_color[(ulong)uVar16 - 1][2] =
           (ulong)(this->field_0).field_0.r + new_color[(ulong)uVar16 - 1][2];
      new_color[uVar16][0] = (ulong)(this->field_0).field_0.g + new_color[uVar16][0];
      new_color[uVar16][1] = (ulong)(this->field_0).field_0.b + new_color[uVar16][1];
      (&vec_g)[uVar16] = (&vec_g)[uVar16] + 1;
    }
    if ((vec_g == 0) || (vec_r == 0)) break;
    for (i_6 = 0; uVar2 = i_5._2_1_, i_6 < 2; i_6 = i_6 + 1) {
      for (energy[1] = 0; energy[1] < 3; energy[1] = energy[1] + 1) {
        *(char *)((long)&i_5 + (ulong)energy[1] + (ulong)i_6 * 3 + 2) =
             (char)((new_color[(ulong)i_6 - 1][(ulong)energy[1] + 2] +
                    (ulong)((uint)(&vec_g)[i_6] >> 1)) / (ulong)(uint)(&vec_g)[i_6]);
      }
    }
    puVar18 = color_quad<unsigned_char,_int>::operator[]
                        ((color_quad<unsigned_char,_int> *)&opp_index,0);
    uVar9 = i_5._3_1_;
    if ((((uVar2 == *puVar18) &&
         (puVar18 = color_quad<unsigned_char,_int>::operator[]
                              ((color_quad<unsigned_char,_int> *)&opp_index,1), uVar2 = (uchar)j,
         uVar9 == *puVar18)) &&
        (puVar18 = color_quad<unsigned_char,_int>::operator[]
                             ((color_quad<unsigned_char,_int> *)&opp_index,2), uVar9 = j._1_1_,
        uVar2 == *puVar18)) &&
       (((puVar18 = color_quad<unsigned_char,_int>::operator[]
                              ((color_quad<unsigned_char,_int> *)&cMaxIters,0), uVar2 = j._2_1_,
         uVar9 == *puVar18 &&
         (puVar18 = color_quad<unsigned_char,_int>::operator[]
                              ((color_quad<unsigned_char,_int> *)&cMaxIters,1), uVar9 = j._3_1_,
         uVar2 == *puVar18)) &&
        (puVar18 = color_quad<unsigned_char,_int>::operator[]
                             ((color_quad<unsigned_char,_int> *)&cMaxIters,2), uVar9 == *puVar18))))
    break;
    for (energy[0] = 0; energy[0] < 3; energy[0] = energy[0] + 1) {
      uVar2 = *(uchar *)((long)&i_5 + (ulong)energy[0] + 2);
      puVar18 = color_quad<unsigned_char,_int>::operator[]
                          ((color_quad<unsigned_char,_int> *)&opp_index,energy[0]);
      *puVar18 = uVar2;
      uVar2 = *(uchar *)((long)&j + (ulong)energy[0] + 1);
      puVar18 = color_quad<unsigned_char,_int>::operator[]
                          ((color_quad<unsigned_char,_int> *)&cMaxIters,energy[0]);
      *puVar18 = uVar2;
    }
  }
  memset(&local_12c,0,8);
  for (local_130 = 0; local_130 < 3; local_130 = local_130 + 1) {
    pbVar17 = color_quad<unsigned_char,_int>::operator[]
                        ((color_quad<unsigned_char,_int> *)&opp_index,local_130);
    bVar1 = *pbVar17;
    pbVar17 = color_quad<unsigned_char,_int>::operator[]
                        ((color_quad<unsigned_char,_int> *)&opp_index,local_130);
    local_12c = (uint)bVar1 * (uint)*pbVar17 + local_12c;
    pbVar17 = color_quad<unsigned_char,_int>::operator[]
                        ((color_quad<unsigned_char,_int> *)&cMaxIters,local_130);
    bVar1 = *pbVar17;
    pbVar17 = color_quad<unsigned_char,_int>::operator[]
                        ((color_quad<unsigned_char,_int> *)&cMaxIters,local_130);
    i_7 = (uint)bVar1 * (uint)*pbVar17 + i_7;
  }
  if (i_7 < local_12c) {
    std::swap<crnlib::color_quad<unsigned_char,int>>
              ((color_quad<unsigned_char,_int> *)&opp_index,
               (color_quad<unsigned_char,_int> *)&cMaxIters);
  }
  color_quad<unsigned_char,_int>::operator=(lo,(color_quad<unsigned_char,_int> *)&opp_index);
  color_quad<unsigned_char,_int>::operator=(hi,(color_quad<unsigned_char,_int> *)&cMaxIters);
  return;
}

Assistant:

void find_representative_colors(uint n, const color_quad_u8* pBlock, color_quad_u8& lo, color_quad_u8& hi)
        {
            uint64 ave64[3];
            ave64[0] = 0;
            ave64[1] = 0;
            ave64[2] = 0;

            for (uint i = 0; i < n; i++)
            {
                ave64[0] += pBlock[i].r;
                ave64[1] += pBlock[i].g;
                ave64[2] += pBlock[i].b;
            }

            uint ave[3];
            ave[0] = static_cast<uint>((ave64[0] + (n / 2)) / n);
            ave[1] = static_cast<uint>((ave64[1] + (n / 2)) / n);
            ave[2] = static_cast<uint>((ave64[2] + (n / 2)) / n);

            int furthest_dist = -1;
            uint furthest_index = 0;
            for (uint i = 0; i < n; i++)
            {
                int r = pBlock[i].r - ave[0];
                int g = pBlock[i].g - ave[1];
                int b = pBlock[i].b - ave[2];
                int dist = r * r + g * g + b * b;
                if (dist > furthest_dist)
                {
                    furthest_dist = dist;
                    furthest_index = i;
                }
            }

            color_quad_u8 lo_color(pBlock[furthest_index]);

            int opp_dist = -1;
            uint opp_index = 0;
            for (uint i = 0; i < n; i++)
            {
                int r = pBlock[i].r - lo_color.r;
                int g = pBlock[i].g - lo_color.g;
                int b = pBlock[i].b - lo_color.b;
                int dist = r * r + g * g + b * b;
                if (dist > opp_dist)
                {
                    opp_dist = dist;
                    opp_index = i;
                }
            }

            color_quad_u8 hi_color(pBlock[opp_index]);

            for (uint i = 0; i < 3; i++)
            {
                lo_color[i] = static_cast<uint8>((lo_color[i] + ave[i]) >> 1);
                hi_color[i] = static_cast<uint8>((hi_color[i] + ave[i]) >> 1);
            }

            const uint cMaxIters = 4;
            for (uint iter_index = 0; iter_index < cMaxIters; iter_index++)
            {
                if ((lo_color[0] == hi_color[0]) && (lo_color[1] == hi_color[1]) && (lo_color[2] == hi_color[2]))
                {
                    break;
                }

                uint64 new_color[2][3];
                uint weight[2];

                utils::zero_object(new_color);
                utils::zero_object(weight);

                int vec_r = hi_color[0] - lo_color[0];
                int vec_g = hi_color[1] - lo_color[1];
                int vec_b = hi_color[2] - lo_color[2];

                int lo_dot = vec_r * lo_color[0] + vec_g * lo_color[1] + vec_b * lo_color[2];
                int hi_dot = vec_r * hi_color[0] + vec_g * hi_color[1] + vec_b * hi_color[2];
                int mid_dot = lo_dot + hi_dot;

                vec_r *= 2;
                vec_g *= 2;
                vec_b *= 2;

                for (uint i = 0; i < n; i++)
                {
                    const color_quad_u8& c = pBlock[i];

                    const int dot = c[0] * vec_r + c[1] * vec_g + c[2] * vec_b;
                    const uint match_index = (dot > mid_dot);

                    new_color[match_index][0] += c.r;
                    new_color[match_index][1] += c.g;
                    new_color[match_index][2] += c.b;
                    weight[match_index]++;
                }

                if ((!weight[0]) || (!weight[1]))
                {
                    break;
                }

                uint8 new_color8[2][3];

                for (uint j = 0; j < 2; j++)
                {
                    for (uint i = 0; i < 3; i++)
                    {
                        new_color8[j][i] = static_cast<uint8>((new_color[j][i] + (weight[j] / 2)) / weight[j]);
                    }
                }

                if ((new_color8[0][0] == lo_color[0]) && (new_color8[0][1] == lo_color[1]) && (new_color8[0][2] == lo_color[2]) &&
                    (new_color8[1][0] == hi_color[0]) && (new_color8[1][1] == hi_color[1]) && (new_color8[1][2] == hi_color[2]))
                {
                    break;
                }

                for (uint i = 0; i < 3; i++)
                {
                    lo_color[i] = new_color8[0][i];
                    hi_color[i] = new_color8[1][i];
                }
            }

            uint energy[2] = { 0, 0 };
            for (uint i = 0; i < 3; i++)
            {
                energy[0] += lo_color[i] * lo_color[i];
                energy[1] += hi_color[i] * hi_color[i];
            }

            if (energy[0] > energy[1])
            {
                std::swap(lo_color, hi_color);
            }

            lo = lo_color;
            hi = hi_color;
        }